

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::cmCTestLaunch(cmCTestLaunch *this,int argc,char **argv)

{
  bool bVar1;
  cmsysProcess *pcVar2;
  
  (this->RealArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RealArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RealArgs).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCTestLaunchReporter::cmCTestLaunchReporter(&this->Reporter);
  this->Process = (cmsysProcess_s *)0x0;
  bVar1 = ParseArguments(this,argc,argv);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(this->Reporter).RealArgs,&this->RealArgs);
    cmCTestLaunchReporter::ComputeFileNames(&this->Reporter);
    this->ScrapeRulesLoaded = false;
    this->HaveOut = false;
    this->HaveErr = false;
    pcVar2 = cmsysProcess_New();
    this->Process = pcVar2;
  }
  return;
}

Assistant:

cmCTestLaunch::cmCTestLaunch(int argc, const char* const* argv)
{
  this->Process = nullptr;

  if (!this->ParseArguments(argc, argv)) {
    return;
  }

  this->Reporter.RealArgs = this->RealArgs;
  this->Reporter.ComputeFileNames();

  this->ScrapeRulesLoaded = false;
  this->HaveOut = false;
  this->HaveErr = false;
  this->Process = cmsysProcess_New();
}